

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_affects(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int i;
  long lVar2;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  AFFECT_DATA *pAVar4;
  int iVar5;
  AFFECT_DATA *pAVar6;
  char *pcVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  int *local_12e8;
  ulong local_12e0;
  string local_12d8;
  string local_12b8;
  string buffer;
  char *local_1278;
  size_type sStack_1270;
  char *local_1268;
  char *local_1258;
  size_type sStack_1250;
  char *local_1248;
  char buf [4608];
  
  pAVar4 = ch->affected;
  if ((pAVar4 == (AFFECT_DATA *)0x0) ||
     ((pAVar4->aftype == 5 && (pAVar4->next == (AFFECT_DATA *)0x0)))) {
    send_to_char("You are not affected by anything.\n\r",ch);
    return;
  }
  pAVar4 = (AFFECT_DATA *)&ch->affected;
  send_to_char("You are affected by:\n\r",ch);
  pAVar6 = (AFFECT_DATA *)0x0;
LAB_002aac4c:
  do {
    do {
      pAVar4 = pAVar4->next;
      if (pAVar4 == (AFFECT_DATA *)0x0) {
        return;
      }
    } while (pAVar4->aftype == 5);
    for (lVar2 = 0; lVar2 != 0x1200; lVar2 = lVar2 + 1) {
      buf[lVar2] = '\0';
    }
    if ((pAVar6 == (AFFECT_DATA *)0x0) || (pAVar4->type != pAVar6->type)) {
LAB_002aacd8:
      local_12e8 = &pAVar4->aftype;
      switch(pAVar4->aftype) {
      case 1:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Skill  : %-17s";
        break;
      case 2:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Power  : %-17s";
        break;
      case 3:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Malady : %-17s";
        break;
      case 4:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Commune: %-17s";
        break;
      case 5:
        goto switchD_002aacfa_caseD_5;
      case 6:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Rune   : %-17s";
        break;
      case 7:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Timer  : %-17s";
        break;
      default:
        pcVar3 = pAVar4->name;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = skill_table[pAVar4->type].name;
        }
        pcVar7 = "Spell  : %-17s";
      }
      sprintf(buf,pcVar7,pcVar3);
      goto LAB_002aae7f;
    }
    if ((pAVar4->name != (char *)0x0 || pAVar6->name != (char *)0x0) &&
       (bVar1 = str_cmp(pAVar4->name,pAVar6->name), bVar1)) goto LAB_002aacd8;
  } while (ch->level < 0x14);
  builtin_strncpy(buf + 0x10,"          ",0xb);
  builtin_strncpy(buf,"                ",0x10);
switchD_002aacfa_caseD_5:
  local_12e8 = &pAVar4->aftype;
LAB_002aae7f:
  send_to_char(buf,ch);
  if (ch->level < 0x14) goto LAB_002ab095;
  local_12e0 = (ulong)(uint)(int)pAVar4->duration;
  if ((long)pAVar4->mod_name < 0) {
    pcVar3 = affect_loc_name((int)pAVar4->location);
    if (-1 < pAVar4->mod_name) goto LAB_002aaeda;
    std::__cxx11::to_string(&local_12d8,(int)pAVar4->modifier);
    pcVar7 = " by ";
  }
  else {
    pcVar3 = mod_names[pAVar4->mod_name].name;
LAB_002aaeda:
    pcVar7 = "";
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12d8,"",&local_12e9);
  }
  local_1258 = local_12d8._M_dataplus._M_p;
  sStack_1250 = local_12d8._M_string_length;
  fmt.size_ = 0xdcc;
  fmt.data_ = (char *)0x12;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_1278;
  local_1278 = pcVar3;
  local_1268 = pcVar7;
  ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"| modifies {}{}{} ",fmt,args);
  std::__cxx11::string::~string((string *)&local_12d8);
  if (*local_12e8 != 5) {
    send_to_char(buffer._M_dataplus._M_p,ch);
  }
  if (pAVar4->duration == -1) {
    std::__cxx11::string::assign((char *)&buffer);
  }
  else {
    iVar5 = (int)local_12e0 + 1;
    if ((short)local_12e0 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_12b8,"",&local_12ea);
      local_1268 = "";
    }
    else {
      std::__cxx11::to_string(&local_12b8,iVar5 / 2);
      local_1268 = " and";
    }
    bVar1 = (local_12e0 & 1) != 0;
    if (bVar1) {
      local_1268 = "";
    }
    local_1258 = "";
    if (!bVar1) {
      local_1258 = " a half";
    }
    local_1248 = "s";
    if (iVar5 == 2) {
      local_1248 = "";
    }
    if ((short)local_12e0 == 0) {
      local_1248 = "";
    }
    local_1278 = local_12b8._M_dataplus._M_p;
    sStack_1270 = local_12b8._M_string_length;
    fmt_00.size_ = 0xcccd;
    fmt_00.data_ = (char *)0x11;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_1278;
    ::fmt::v9::vformat_abi_cxx11_(&local_12d8,(v9 *)"for%s%s%s hour%s.",fmt_00,args_00);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&local_12d8);
    std::__cxx11::string::~string((string *)&local_12d8);
    std::__cxx11::string::~string((string *)&local_12b8);
  }
  if (*local_12e8 != 5) {
    send_to_char(buffer._M_dataplus._M_p,ch);
  }
  std::__cxx11::string::~string((string *)&buffer);
LAB_002ab095:
  pAVar6 = pAVar4;
  if (*local_12e8 != 5) {
    send_to_char("\n\r",ch);
  }
  goto LAB_002aac4c;
}

Assistant:

void do_affects(CHAR_DATA *ch, char *argument)
{
	if (ch->affected == nullptr || !(ch->affected->aftype != AFT_INVIS || ch->affected->next != nullptr))
	{
		send_to_char("You are not affected by anything.\n\r", ch);
		return;
	}

	send_to_char("You are affected by:\n\r", ch);

	AFFECT_DATA *paf_last = nullptr;
	char buf[MAX_STRING_LENGTH];
	for (auto paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_INVIS)
			continue;

		for (auto i = 0; i < MAX_STRING_LENGTH; i++)
		{
			buf[i] = '\0';
		}

		if (paf_last != nullptr
			&& (paf->type == paf_last->type && ((paf->name == nullptr && paf_last->name == nullptr) || !str_cmp(paf->name, paf_last->name))))
		{
			if (ch->level >= 20)
				sprintf(buf, "                          ");
			else
				continue;
		}
		else
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_MALADY)
				sprintf(buf, "Malady : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_RUNE)
				sprintf(buf, "Rune   : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_TIMER)
				sprintf(buf, "Timer  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype != AFT_INVIS)
				sprintf(buf, "Spell  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
		}

		send_to_char(buf, ch);

		if (ch->level >= 20)
		{
			auto showdur = paf->duration + 1;

			auto buffer = fmt::format("| modifies {}{}{} ",
					(paf->mod_name > -1) ? mod_names[paf->mod_name].name : affect_loc_name(paf->location),
					(paf->mod_name > -1) ? "" : " by ",
					(paf->mod_name > -1) ? "" : std::to_string(paf->modifier)); //TODO: change the rest of the sprintf calls to format

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);

			if (paf->duration == -1)
			{
				buffer = "permanently";
			}
			else
			{
				buffer = fmt::format("for%s%s%s hour%s.",
					(showdur == 1) ? "" : std::to_string(showdur / 2),
					(showdur % 2 == 0) ? "" : (showdur == 1) ? "" : " and", (showdur % 2 == 0) ? "" : " a half",
					(showdur == 1 || showdur == 2) ? "" : "s");
			}

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);
		}

		if (paf->aftype != AFT_INVIS)
			send_to_char("\n\r", ch);

		paf_last = paf;
	}
}